

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O0

void __thiscall IRBuilderAsmJs::BuildEmpty(IRBuilderAsmJs *this,OpCodeAsmJs newOpcode,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  ValueType valueType;
  int offset_00;
  Which WVar3;
  Which asmType;
  RegSlot RVar4;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  Instr *pIVar5;
  IntConstOpnd *newSrc_00;
  undefined4 *puVar6;
  AsmJsRetType local_40;
  AsmJsType local_3c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_38;
  IRType local_35;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  ValueType vType;
  IRType irType;
  RegOpnd *pRStack_28;
  RegSlot retSlot;
  RegOpnd *regOpnd;
  Instr *instr;
  uint32 offset_local;
  OpCodeAsmJs newOpcode_local;
  IRBuilderAsmJs *this_local;
  
  Js::ByteCodeReader::Empty(&this->m_jnReader);
  pRStack_28 = (RegOpnd *)0x0;
  if (newOpcode != Label) {
    if (newOpcode == Ret) {
      pIVar5 = IR::Instr::New(Ret,this->m_func);
      WVar3 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
      switch(WVar3) {
      case Int64:
        RVar4 = GetRegSlotFromInt64Reg(this,0);
        pRStack_28 = BuildDstOpnd(this,RVar4,TyInt64);
        local_34.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::GetInt(false);
        IR::Opnd::SetValueType(&pRStack_28->super_Opnd,(ValueType)local_34.field_0);
        break;
      case Double:
        RVar4 = GetRegSlotFromDoubleReg(this,0);
        pRStack_28 = BuildDstOpnd(this,RVar4,TyFloat64);
        local_32 = ValueType::Float.field_0;
        IR::Opnd::SetValueType(&pRStack_28->super_Opnd,ValueType::Float);
        break;
      case Float:
        RVar4 = GetRegSlotFromFloatReg(this,0);
        pRStack_28 = BuildDstOpnd(this,RVar4,TyFloat32);
        vType = ValueType::Float;
        IR::Opnd::SetValueType(&pRStack_28->super_Opnd,ValueType::Float);
        break;
      default:
        ValueType::ValueType((ValueType *)&local_38.field_0);
        WVar3 = AsmJsJITInfo::GetRetType(this->m_asmFuncInfo);
        Js::AsmJsRetType::AsmJsRetType(&local_40,WVar3);
        local_3c = Js::AsmJsRetType::toType(&local_40);
        asmType = Js::AsmJsType::GetWhich(&local_3c);
        GetSimdTypesFromAsmType(this,asmType,&local_35,(ValueType *)&local_38.field_0);
        RVar4 = GetRegSlotFromSimd128Reg(this,0);
        pRStack_28 = BuildDstOpnd(this,RVar4,local_35);
        IR::Opnd::SetValueType(&pRStack_28->super_Opnd,(ValueType)local_38);
        break;
      case Signed:
        RVar4 = GetRegSlotFromIntReg(this,0);
        pRStack_28 = BuildDstOpnd(this,RVar4,TyInt32);
        valueType = ValueType::GetInt(false);
        IR::Opnd::SetValueType(&pRStack_28->super_Opnd,valueType);
        break;
      case Void:
      }
      if (pRStack_28 != (RegOpnd *)0x0) {
        IR::Instr::SetSrc1(pIVar5,&pRStack_28->super_Opnd);
      }
      AddInstr(this,pIVar5,offset);
    }
    else if (newOpcode == CheckHeap) {
      pIVar5 = IR::Instr::New(ArrayDetachedCheck,this->m_func);
      baseOpnd = BuildSrcOpnd(this,2,TyVar);
      offset_00 = Js::ArrayBufferBase::GetIsDetachedOffset();
      newSrc = IR::IndirOpnd::New(baseOpnd,offset_00,TyInt8,this->m_func,false);
      IR::Instr::SetSrc1(pIVar5,&newSrc->super_Opnd);
      AddInstr(this,pIVar5,offset);
    }
    else if (newOpcode == Unreachable_Void) {
      pIVar5 = IR::Instr::New(ThrowRuntimeError,this->m_func);
      newSrc_00 = IR::IntConstOpnd::New(0x1b59,TyInt32,pIVar5->m_func,false);
      IR::Instr::SetSrc1(pIVar5,&newSrc_00->super_Opnd);
      AddInstr(this,pIVar5,offset);
    }
    else {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilderAsmJs.cpp"
                         ,0x4a2,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
  }
  return;
}

Assistant:

void
IRBuilderAsmJs::BuildEmpty(Js::OpCodeAsmJs newOpcode, uint32 offset)
{
    m_jnReader.Empty();

    IR::Instr * instr = nullptr;
    IR::RegOpnd * regOpnd = nullptr;
    Js::RegSlot retSlot;
    switch (newOpcode)
    {
    case Js::OpCodeAsmJs::CheckHeap:
        instr = IR::Instr::New(Js::OpCode::ArrayDetachedCheck, m_func);
        instr->SetSrc1(IR::IndirOpnd::New(BuildSrcOpnd(AsmJsRegSlots::ArrayReg, TyVar), Js::ArrayBuffer::GetIsDetachedOffset(), TyInt8, m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Unreachable_Void:
        instr = IR::Instr::New(Js::OpCode::ThrowRuntimeError, m_func);
        instr->SetSrc1(IR::IntConstOpnd::New(SCODE_CODE(WASMERR_Unreachable), TyInt32, instr->m_func));
        AddInstr(instr, offset);
        break;
    case Js::OpCodeAsmJs::Ret:
        instr = IR::Instr::New(Js::OpCode::Ret, m_func);

        switch (m_asmFuncInfo->GetRetType())
        {
        case Js::AsmJsRetType::Which::Signed:
            retSlot = GetRegSlotFromIntReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt32);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Float:
            retSlot = GetRegSlotFromFloatReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat32);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsRetType::Which::Double:
            retSlot = GetRegSlotFromDoubleReg(0);
            regOpnd = BuildDstOpnd(retSlot, TyFloat64);
            regOpnd->SetValueType(ValueType::Float);
            break;

        case Js::AsmJsVarType::Which::Int64:
            retSlot = GetRegSlotFromInt64Reg(0);
            regOpnd = BuildDstOpnd(retSlot, TyInt64);
            regOpnd->SetValueType(ValueType::GetInt(false));
            break;

        case Js::AsmJsRetType::Which::Void:
            break;

        default:
        {
            IRType irType;
            ValueType vType;
            GetSimdTypesFromAsmType(Js::AsmJsRetType(m_asmFuncInfo->GetRetType()).toType().GetWhich(), &irType, &vType);
            retSlot = GetRegSlotFromSimd128Reg(0);
            regOpnd = BuildDstOpnd(retSlot, irType);
            regOpnd->SetValueType(vType);
        }

        }
        if (regOpnd)
        {
            instr->SetSrc1(regOpnd);
        }
        AddInstr(instr, offset);
        break;

    case Js::OpCodeAsmJs::Label:
        // NOP
        break;

    default:
        Assume(UNREACHED);
    }
}